

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O0

array<unsigned_char,_8UL> mvm::num::serial_floating<double,8ul>(double val)

{
  bool bVar1;
  ulong uVar2;
  array<unsigned_char,_8UL> aVar3;
  double dVar4;
  unsigned_type u_bytes;
  unsigned_type u_mant;
  unsigned_type u_exp;
  unsigned_type neg;
  double d_mant;
  double dStack_20;
  int32_t exp;
  double tval;
  double val_local;
  
  dStack_20 = val;
  tval = val;
  dVar4 = frexp(val,(int *)((long)&d_mant + 4));
  d_mant._4_4_ = d_mant._4_4_ + 0x3fe;
  bVar1 = std::signbit(dStack_20);
  uVar2 = (ulong)d_mant._4_4_;
  dVar4 = ldexp(ABS(dVar4) + ABS(dVar4) + -1.0,0x34);
  aVar3 = serial_unsigned<8ul>
                    ((ulong)bVar1 << 0x3f |
                     (uVar2 & 0x7ff) << 0x34 |
                     ((long)dVar4 | (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f) &
                     0xfffffffffffffU);
  aVar3._M_elems[0] = aVar3._M_elems[0];
  aVar3._M_elems[1] = aVar3._M_elems[1];
  aVar3._M_elems[2] = aVar3._M_elems[2];
  aVar3._M_elems[3] = aVar3._M_elems[3];
  aVar3._M_elems[4] = aVar3._M_elems[4];
  aVar3._M_elems[5] = aVar3._M_elems[5];
  aVar3._M_elems[6] = aVar3._M_elems[6];
  aVar3._M_elems[7] = aVar3._M_elems[7];
  return (array<unsigned_char,_8UL>)aVar3._M_elems;
}

Assistant:

auto serial_floating(double val) {
  T tval = static_cast<T>(val);

  if constexpr (N == 4 || N == 8) {
    using ieee754_type = traits::ieee754_traits<N>;
    using unsigned_type = typename ieee754_type::unsigned_type;

    int32_t exp;
    auto d_mant = std::frexp(tval, &exp);

    // exp to store
    exp = exp - 1 + ieee754_type::exp_shift; // -1 because the radix point is
                                             // shifted in frexp

    unsigned_type neg = std::signbit(tval);
    d_mant = fabs(d_mant) * 2 - 1; // again the shift is the radix point

    unsigned_type u_exp = exp;
    unsigned_type u_mant =
        static_cast<unsigned_type>(std::ldexp(d_mant, ieee754_type::mant_size));

    unsigned_type u_bytes;
    u_bytes = (u_mant & ieee754_type::mant_mask);
    u_bytes |= ((u_exp & ieee754_type::exp_mask) << ieee754_type::mant_size);
    u_bytes |=
        ((neg & 0x1) << (ieee754_type::mant_size + ieee754_type::exp_size));

    return serial_unsigned<N>(u_bytes);
  }
}